

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_append_failure_bufferExpansionFailed_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 5;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x11482e;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,6);
  builtin_strncpy(array.buffer,"01234",6);
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  c = '\0';
  uStack_60 = 0x114872;
  bVar1 = private_ACUtils_ADynArray_insertArray(&array,0xffffffffffffffff,&c,1,1);
  if (bVar1 != false) {
    local_78 = (char *)(ulong)bVar1;
    ppcVar6 = &local_78;
    local_70 = "false";
    pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer)) == false"
    ;
    pcVar8 = "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer))"
    ;
    iVar2 = 0x513;
    goto LAB_00114adb;
  }
  uStack_60 = 0x11488b;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x513);
  if (array.size == 5) {
    uStack_60 = 0x1148ab;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x514);
    if (array.capacity == 5) {
      uStack_60 = 0x1148cb;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x515);
      if (array.buffer == (char *)0x0) {
        ppcVar6 = &local_68;
        pcVar4 = "Assertion \'_ck_x != NULL\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.buffer != NULL";
        pcVar8 = "(void*) array.buffer";
        iVar2 = 0x516;
LAB_00114adb:
        uStack_60 = 0;
        local_68 = (char *)0x0;
        *(code **)((long)ppcVar6 + -8) = test_ADynArray_append_failure_nullptr_fn;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
      }
      uStack_60 = 0x1148e8;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x516);
      pcStack_90 = array.buffer;
      if (array.buffer == (char *)0x0) {
        pcVar3 = "";
        pcStack_90 = "(null)";
      }
      else {
        uStack_60 = 0x114905;
        iVar2 = strcmp("01234",array.buffer);
        if (iVar2 == 0) {
          uStack_60 = 0x11491e;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x517);
          if (array.growStrategy != (ACUtilsGrowStrategy)0x0) {
            uStack_60 = 0x11493b;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x518);
            uStack_60 = 0x114944;
            (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
            return;
          }
          ppcVar6 = &local_68;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.growStrategy != NULL";
          pcVar8 = "(void*) array.growStrategy";
          iVar2 = 0x518;
          goto LAB_00114adb;
        }
        pcVar3 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "array.buffer == \"01234\"";
      pcVar7 = "array.buffer";
      iVar2 = 0x517;
      local_68 = "\"";
      local_70 = "01234";
      local_78 = "\"";
      pcStack_80 = "\"01234\"";
      ppcVar5 = &pcStack_90;
      pcStack_88 = pcVar3;
      goto LAB_00114aa1;
    }
    pcVar4 = "array.capacity == 5";
    pcVar7 = "array.capacity";
    iVar2 = 0x515;
    pcVar3 = (char *)array.capacity;
  }
  else {
    pcVar4 = "array.size == 5";
    pcVar7 = "array.size";
    iVar2 = 0x514;
    pcVar3 = (char *)array.size;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  local_68 = (char *)0x5;
  ppcVar5 = &local_70;
  local_70 = "5";
LAB_00114aa1:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x114aa8;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_append_failure_bufferExpansionFailed)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 1);
    memcpy(array.buffer, "01234", 6);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_append(&array, c), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.deallocator(array.buffer);
}